

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::View<unsigned_char,false,std::allocator<unsigned_long>>::
constView<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
          (View<unsigned_char,false,std::allocator<unsigned_long>> *this,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          bit,__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              sit,CoordinateOrder *internalCoordinateOrder,
          View<unsigned_char,_true,_std::allocator<unsigned_long>_> *out)

{
  size_t this_00;
  View<unsigned_char,_true,_std::allocator<unsigned_long>_> *internalCoordinateOrder_00;
  size_t __n;
  size_t *it;
  pointer data;
  allocator<unsigned_char> local_51;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_50;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_48;
  unsigned_long *local_40;
  size_t local_38;
  size_t offset;
  View<unsigned_char,_true,_std::allocator<unsigned_long>_> *out_local;
  CoordinateOrder *internalCoordinateOrder_local;
  View<unsigned_char,_false,_std::allocator<unsigned_long>_> *this_local;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  sit_local;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  bit_local;
  
  offset = (size_t)out;
  out_local = (View<unsigned_char,_true,_std::allocator<unsigned_long>_> *)internalCoordinateOrder;
  internalCoordinateOrder_local = (CoordinateOrder *)this;
  this_local = (View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)sit._M_current;
  sit_local = bit;
  View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this);
  local_38 = 0;
  local_40 = sit_local._M_current;
  coordinatesToOffset<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (this,sit_local,&local_38);
  this_00 = offset;
  local_48._M_current = (unsigned_long *)this_local;
  __n = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension
                  ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)this);
  local_50 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator+((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&this_local,__n);
  it = marray_detail::Geometry<std::allocator<unsigned_long>_>::stridesBegin
                 ((Geometry<std::allocator<unsigned_long>_> *)(this + 8));
  internalCoordinateOrder_00 = out_local;
  data = (pointer)(*(long *)this + local_38);
  std::allocator<unsigned_char>::allocator(&local_51);
  View<unsigned_char,true,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long_const*>
            ((View<unsigned_char,true,std::allocator<unsigned_long>> *)this_00,local_48,local_50,it,
             data,(CoordinateOrder *)internalCoordinateOrder_00,&local_51);
  std::allocator<unsigned_char>::~allocator(&local_51);
  return;
}

Assistant:

inline void
View<T, isConst, A>::constView
(
    BaseIterator bit,
    ShapeIterator sit,
    const CoordinateOrder& internalCoordinateOrder,
    View<T, true, A>& out
) const
{
    testInvariant();
    std::size_t offset = 0;
    coordinatesToOffset(bit, offset);
    out.assign(sit, sit+dimension(), 
        geometry_.stridesBegin(), 
        static_cast<const T*>(data_) + offset,
        internalCoordinateOrder);
}